

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queryOutputWindow.cpp
# Opt level: O0

void __thiscall QueryOutputWindow::QueryOutputWindow(QueryOutputWindow *this)

{
  QueryOutputWindow *this_local;
  
  IWindow::IWindow(&this->super_IWindow);
  (this->super_IWindow)._vptr_IWindow = (_func_int **)&PTR__QueryOutputWindow_00113cf8;
  std::vector<QueryOutputMessage_*,_std::allocator<QueryOutputMessage_*>_>::vector(&this->buffer);
  std::vector<IResult_*,_std::allocator<IResult_*>_>::vector(&this->resultBuffer);
  (*(this->super_IWindow)._vptr_IWindow[3])(this,0,(ulong)(_LINES - 4));
  this->lineCounter = 0;
  init_pair(1,7,0);
  wbkgd((this->super_IWindow).window,0x100);
  return;
}

Assistant:

QueryOutputWindow::QueryOutputWindow()
{
	this->resize(0, LINES - 4);
	this->lineCounter = 0;

	init_pair(COLOUR_SCHEME_OUTPUT, COLOUR_SCHEME_SECONDARY, COLOUR_SCHEME_PRIMARY);
	wbkgd(this->window, COLOR_PAIR(COLOUR_SCHEME_OUTPUT));
}